

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLFileData.h
# Opt level: O2

void __thiscall Assimp::MDL::IntBone_MDL7::IntBone_MDL7(IntBone_MDL7 *this)

{
  aiBone::aiBone(&this->super_aiBone);
  this->iParent = 0xffff;
  (this->vPosition).x = 0.0;
  (this->vPosition).y = 0.0;
  (this->vPosition).z = 0.0;
  (this->pkeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pkeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pkeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pkeyScalings).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pkeyScalings).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pkeyScalings).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pkeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pkeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pkeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(&this->pkeyPositions,0x1e);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(&this->pkeyScalings,0x1e);
  std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::reserve(&this->pkeyRotations,0x1e);
  return;
}

Assistant:

IntBone_MDL7() AI_NO_EXCEPT : iParent (0xffff)
    {
        pkeyPositions.reserve(30);
        pkeyScalings.reserve(30);
        pkeyRotations.reserve(30);
    }